

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_x86_movS32IntoMemoryWithOffset
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,int32_t offset,
               int32_t immediate)

{
  uint8_t reg;
  uint8_t uVar5;
  uint8_t local_42 [3];
  uint8_t local_3f;
  uint8_t local_3e;
  uint8_t local_3d;
  uint8_t local_3c;
  uint8_t local_3b;
  uint8_t instruction_3 [11];
  uint8_t instruction_2 [12];
  uint8_t instruction_1 [7];
  uint8_t instruction [8];
  int32_t immediate_local;
  int32_t offset_local;
  sysbvm_x86_register_t destination_local;
  sysbvm_bytecodeJit_t *jit_local;
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar6;
  uint8_t uVar7;
  
  reg = (uint8_t)destination;
  uVar1 = (uint8_t)immediate;
  uVar2 = (uint8_t)((uint)immediate >> 8);
  uVar3 = (uint8_t)((uint)immediate >> 0x10);
  uVar4 = (uint8_t)((uint)immediate >> 0x18);
  if ((offset == 0) && ((destination & SYSBVM_X86_64_ARG0) != SYSBVM_X86_EBP)) {
    if ((destination & SYSBVM_X86_64_ARG0) == SYSBVM_X86_ESP) {
      instruction_2[0xb] = sysbvm_jit_x86_rex(true,false,false,SYSBVM_X86_64_ARG0 < destination);
      sysbvm_jit_x86_modRM(reg,'\0','\0');
      sysbvm_jit_x86_sibOnlyBase(reg);
      sysbvm_bytecodeJit_addBytes(jit,8,instruction_2 + 0xb);
    }
    else {
      instruction_2[4] = sysbvm_jit_x86_rex(true,false,false,SYSBVM_X86_64_ARG0 < destination);
      instruction_2[5] = 199;
      instruction_2[6] = sysbvm_jit_x86_modRM(reg,'\0','\0');
      instruction_2[7] = uVar1;
      instruction_2[8] = uVar2;
      instruction_2[9] = uVar3;
      instruction_2[10] = uVar4;
      sysbvm_bytecodeJit_addBytes(jit,7,instruction_2 + 4);
    }
  }
  else {
    uVar5 = (uint8_t)((uint)offset >> 8);
    uVar6 = (uint8_t)((uint)offset >> 0x10);
    uVar7 = (uint8_t)((uint)offset >> 0x18);
    if ((destination & SYSBVM_X86_64_ARG0) == SYSBVM_X86_ESP) {
      instruction_3[3] = sysbvm_jit_x86_rex(true,false,false,SYSBVM_X86_64_ARG0 < destination);
      instruction_3[4] = 199;
      instruction_3[5] = sysbvm_jit_x86_modRM(reg,'\0','\x02');
      instruction_3[6] = sysbvm_jit_x86_sibOnlyBase(reg);
      instruction_3[7] = (uint8_t)offset;
      instruction_3[8] = uVar5;
      instruction_3[9] = uVar6;
      instruction_3[10] = uVar7;
      instruction_2[0] = uVar1;
      instruction_2[1] = uVar2;
      instruction_2[2] = uVar3;
      instruction_2[3] = uVar4;
      sysbvm_bytecodeJit_addBytes(jit,0xc,instruction_3 + 3);
    }
    else {
      local_42[0] = sysbvm_jit_x86_rex(true,false,false,SYSBVM_X86_64_ARG0 < destination);
      local_42[1] = 199;
      local_42[2] = sysbvm_jit_x86_modRM(reg,'\0','\x02');
      local_3f = (uint8_t)offset;
      local_3e = uVar5;
      local_3d = uVar6;
      local_3c = uVar7;
      local_3b = uVar1;
      instruction_3[0] = uVar2;
      instruction_3[1] = uVar3;
      instruction_3[2] = uVar4;
      sysbvm_bytecodeJit_addBytes(jit,0xb,local_42);
    }
  }
  return;
}

Assistant:

static void sysbvm_jit_x86_movS32IntoMemoryWithOffset(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, int32_t offset, int32_t immediate)
{
    if(offset == 0 && (destination & SYSBVM_X86_REG_HALF_MASK) != SYSBVM_X86_RBP)
    {
        if((destination & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0xC7,
                sysbvm_jit_x86_modRM(destination, 0, 0),
                sysbvm_jit_x86_sibOnlyBase(destination),
                immediate & 0xFF, (immediate >> 8) & 0xFF, (immediate >> 16) & 0xFF, (immediate >> 24) & 0xFF
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0xC7,
                sysbvm_jit_x86_modRM(destination, 0, 0),
                immediate & 0xFF, (immediate >> 8) & 0xFF, (immediate >> 16) & 0xFF, (immediate >> 24) & 0xFF
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
    else
    {
        if((destination & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0xC7,
                sysbvm_jit_x86_modRM(destination, 0, 2),
                sysbvm_jit_x86_sibOnlyBase(destination),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
                immediate & 0xFF, (immediate >> 8) & 0xFF, (immediate >> 16) & 0xFF, (immediate >> 24) & 0xFF
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0xC7,
                sysbvm_jit_x86_modRM(destination, 0, 2),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
                immediate & 0xFF, (immediate >> 8) & 0xFF, (immediate >> 16) & 0xFF, (immediate >> 24) & 0xFF
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
}